

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

Vec_Int_t * Iso_ManFinalize(Iso_Man_t *p)

{
  void *pvVar1;
  long lVar2;
  Aig_Man_t *pAVar3;
  void **ppvVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  int iVar10;
  
  if (p->nClasses != 0) {
    __assert_fail("p->nClasses == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                  ,0x444,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
  }
  if (p->vClasses->nSize != 0) {
    __assert_fail("Vec_PtrSize(p->vClasses) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                  ,0x445,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
  }
  pAVar3 = p->pAig;
  pVVar6 = pAVar3->vObjs;
  if (0 < pVVar6->nSize) {
    lVar2 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar2];
      if (pvVar1 != (void *)0x0) {
        uVar8 = (uint)*(undefined8 *)((long)pvVar1 + 0x18);
        if (((uVar8 & 7) == 2) || (0xfffffffd < (uVar8 & 7) - 7)) {
          iVar10 = *(int *)((long)pvVar1 + 0x24);
          if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
            __assert_fail("i >= 0 && i < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
          }
          iVar10 = p->pObjs[iVar10].Id;
          *(int *)((long)pvVar1 + 0x28) = iVar10;
          if (iVar10 < 1) {
            __assert_fail("pObj->iData > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,0x44f,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
          }
        }
        else {
          *(undefined4 *)((long)pvVar1 + 0x28) = 0xffffffff;
        }
      }
      lVar2 = lVar2 + 1;
      pAVar3 = p->pAig;
      pVVar6 = pAVar3->vObjs;
    } while (lVar2 < pVVar6->nSize);
  }
  (pAVar3->pConst1->field_5).iData = 0;
  p->vTemp1->nSize = 0;
  p->vTemp2->nSize = 0;
  pAVar3 = p->pAig;
  pVVar6 = pAVar3->vCis;
  if (0 < pVVar6->nSize) {
    lVar2 = 0;
    do {
      piVar5 = (int *)pVVar6->pArray[lVar2];
      if (piVar5[10] < 1) {
        __assert_fail("pObj->iData > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                      ,0x457,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
      }
      if (0xfffffffd < (piVar5[6] & 7U) - 7) goto LAB_0062a626;
      if (*piVar5 < pAVar3->nObjs[2] - pAVar3->nRegs) {
        pVVar6 = p->vTemp1;
      }
      else {
        pVVar6 = p->vTemp2;
      }
      uVar8 = pVVar6->nCap;
      if (pVVar6->nSize == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar4;
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar8 * 2;
          if (iVar10 <= (int)uVar8) goto LAB_0062a4e4;
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar6->pArray,(ulong)uVar8 << 4);
          }
          pVVar6->pArray = ppvVar4;
        }
        pVVar6->nCap = iVar10;
      }
LAB_0062a4e4:
      iVar10 = pVVar6->nSize;
      pVVar6->nSize = iVar10 + 1;
      pVVar6->pArray[iVar10] = piVar5;
      lVar2 = lVar2 + 1;
      pAVar3 = p->pAig;
      pVVar6 = pAVar3->vCis;
    } while (lVar2 < pVVar6->nSize);
  }
  sVar9 = (size_t)p->vTemp1->nSize;
  if (1 < (long)sVar9) {
    qsort(p->vTemp1->pArray,sVar9,8,Iso_ObjCompareByData);
  }
  sVar9 = (size_t)p->vTemp2->nSize;
  if (1 < (long)sVar9) {
    qsort(p->vTemp2->pArray,sVar9,8,Iso_ObjCompareByData);
  }
  iVar10 = p->pAig->nObjs[2];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar7 = iVar10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar5;
  pVVar6 = p->vTemp1;
  if (0 < pVVar6->nSize) {
    lVar2 = 0;
    do {
      if (0xfffffffd < (*(uint *)((long)pVVar6->pArray[lVar2] + 0x18) & 7) - 7) goto LAB_0062a626;
      Vec_IntPush(p_00,*pVVar6->pArray[lVar2]);
      lVar2 = lVar2 + 1;
      pVVar6 = p->vTemp1;
    } while (lVar2 < pVVar6->nSize);
  }
  pVVar6 = p->vTemp2;
  if (0 < pVVar6->nSize) {
    lVar2 = 0;
    do {
      if (0xfffffffd < (*(uint *)((long)pVVar6->pArray[lVar2] + 0x18) & 7) - 7) {
LAB_0062a626:
        __assert_fail("!Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
      }
      Vec_IntPush(p_00,*pVVar6->pArray[lVar2]);
      lVar2 = lVar2 + 1;
      pVVar6 = p->vTemp2;
    } while (lVar2 < pVVar6->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Iso_ManFinalize( Iso_Man_t * p )
{
    Vec_Int_t * vRes;
    Aig_Obj_t * pObj;
    int i;
    assert( p->nClasses == 0 );
    assert( Vec_PtrSize(p->vClasses) == 0 );
    // set canonical numbers
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
        {
            pObj->iData = -1;
            continue;
        }
        pObj->iData = Iso_ManObj(p, Aig_ObjId(pObj))->Id;
        assert( pObj->iData > 0 );
    }
    Aig_ManConst1(p->pAig)->iData = 0;
    // assign unique IDs to the CIs
    Vec_PtrClear( p->vTemp1 );
    Vec_PtrClear( p->vTemp2 );
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        assert( pObj->iData > 0 );
        if ( Aig_ObjCioId(pObj) >= Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig) ) // flop
            Vec_PtrPush( p->vTemp2, pObj );
        else // PI
            Vec_PtrPush( p->vTemp1, pObj );
    }
    // sort CIs by their IDs
    Vec_PtrSort( p->vTemp1, (int (*)(void))Iso_ObjCompareByData );
    Vec_PtrSort( p->vTemp2, (int (*)(void))Iso_ObjCompareByData );
    // create the result
    vRes = Vec_IntAlloc( Aig_ManCiNum(p->pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTemp1, pObj, i )
        Vec_IntPush( vRes, Aig_ObjCioId(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTemp2, pObj, i )
        Vec_IntPush( vRes, Aig_ObjCioId(pObj) );
    return vRes;
}